

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O1

void TestSimulations(PlanningUnitDecPOMDPDiscrete *pu,shared_ptr<JointPolicyDiscrete> *jp,
                    size_t nrRuns)

{
  ostream *poVar1;
  double dVar2;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  long *local_f0 [2];
  long local_e0 [2];
  double local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 local_b0;
  undefined4 local_a8;
  double local_a0;
  vector<double,_std::allocator<double>_> local_98;
  undefined8 local_80;
  undefined4 local_78;
  SimulationDecPOMDPDiscrete local_70 [80];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting simulation of ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," runs",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete(local_70,pu,(int)nrRuns,0x7fffffff,false);
  SimulationResult::SimulationResult((SimulationResult *)&local_d0);
  SimulationDecPOMDPDiscrete::RunSimulations((shared_ptr *)&local_a0);
  local_d0 = local_a0;
  std::vector<double,_std::allocator<double>_>::operator=(&local_c8,&local_98);
  local_a8 = local_78;
  local_b0 = local_80;
  SimulationResult::~SimulationResult((SimulationResult *)&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Averaged reward: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<double>(local_d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  dVar2 = (double)(**(code **)(*(long *)pu + 0x98))(pu);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expected reward: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/tmp/tst_sim_results","");
  SimulationResult::Save(&local_d0,local_f0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  SimulationResult::~SimulationResult((SimulationResult *)&local_d0);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_70);
  return;
}

Assistant:

void TestSimulations(PlanningUnitDecPOMDPDiscrete* pu,
                     boost::shared_ptr<JointPolicyDiscrete> jp, size_t nrRuns)
{
//    int nrRuns=10000;
    cout << "Starting simulation of "<<nrRuns<<" runs"<<endl;  

    SimulationDecPOMDPDiscrete sim(*pu,nrRuns);

    SimulationResult result;
    result=sim.RunSimulations(jp);

    cout << "Averaged reward: " << result.GetAvgReward() << endl;
    double er = 0.0;
    try{
        er = pu->GetExpectedReward();
        cout << "Expected reward: " << er  << endl;
    } catch(E& e) {
        //NullPlanner throws exception
        cout << "Expected reward was not defined by planning unit" << endl;
    }


    result.Save("/tmp/tst_sim_results");
}